

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

bool __thiscall embree::TokenStream::decDigits(TokenStream *this,string *str_o)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  Stream<int> *this_00;
  string *in_RSI;
  string str;
  bool ok;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 uVar5;
  undefined1 uVar6;
  Stream<int> *in_stack_ffffffffffffff88;
  
  bVar2 = false;
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88);
  piVar4 = Stream<int>::peek(in_stack_ffffffffffffff88);
  if ((*piVar4 == 0x2b) || (piVar4 = Stream<int>::peek(in_stack_ffffffffffffff88), *piVar4 == 0x2d))
  {
    iVar3 = Stream<int>::get(in_stack_ffffffffffffff88);
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffff88,(char)iVar3);
  }
  while( true ) {
    this_00 = (Stream<int> *)Stream<int>::peek(in_stack_ffffffffffffff88);
    uVar1 = *(uint *)&(this_00->super_RefCount)._vptr_RefCount;
    uVar5 = 0x2f < uVar1 && uVar1 < 0x3a;
    if (0x2f >= uVar1 || uVar1 >= 0x3a) break;
    bVar2 = true;
    iVar3 = Stream<int>::get(in_stack_ffffffffffffff88);
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffff88,(char)iVar3);
  }
  if (bVar2 == false) {
    uVar6 = uVar5;
    std::__cxx11::string::size();
    Stream<int>::unget(this_00,CONCAT17(uVar6,CONCAT16(uVar5,in_stack_ffffffffffffff28)));
  }
  else {
    std::__cxx11::string::operator+=(in_RSI,(string *)&stack0xffffffffffffff88);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  return bVar2;
}

Assistant:

bool TokenStream::decDigits(std::string& str_o)
  {
    bool ok = false;
    std::string str;
    if (cin->peek() == '+' || cin->peek() == '-') str += (char)cin->get();
    while (isDigit(cin->peek())) { ok = true; str += (char)cin->get(); }
    if (ok) str_o += str;
    else cin->unget(str.size());
    return ok;
  }